

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O0

bool Gudhi::persistence_matrix::operator==
               (Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                *c1,Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                    *c2)

{
  uint uVar1;
  bool bVar2;
  ID_index IVar3;
  ID_index IVar4;
  size_type sVar5;
  size_type sVar6;
  reference ppEVar7;
  uint *puVar8;
  bool local_49;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  iterator it2;
  iterator it1;
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *c2_local;
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *c1_local;
  
  if (c1 == c2) {
    c1_local._7_1_ = true;
  }
  else {
    it2 = std::
          set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
          ::begin(&c1->column_);
    local_30._M_node =
         (_Base_ptr)
         std::
         set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
         ::begin(&c2->column_);
    sVar5 = std::
            set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
            ::size(&c1->column_);
    sVar6 = std::
            set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
            ::size(&c2->column_);
    if (sVar5 == sVar6) {
      while( true ) {
        local_38._M_node =
             (_Base_ptr)
             std::
             set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
             ::end(&c1->column_);
        bVar2 = std::operator!=(&it2,&local_38);
        local_49 = false;
        if (bVar2) {
          local_40._M_node =
               (_Base_ptr)
               std::
               set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
               ::end(&c2->column_);
          local_49 = std::operator!=(&local_30,&local_40);
        }
        if (local_49 == false) {
          return true;
        }
        ppEVar7 = std::
                  _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>
                  ::operator*(&it2);
        IVar3 = Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                ::get_row_index(*ppEVar7);
        ppEVar7 = std::
                  _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>
                  ::operator*(&local_30);
        IVar4 = Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                ::get_row_index(*ppEVar7);
        if (IVar3 != IVar4) break;
        ppEVar7 = std::
                  _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>
                  ::operator*(&it2);
        puVar8 = Entry_field_element<unsigned_int>::get_element
                           (&(*ppEVar7)->super_Entry_field_element_option);
        uVar1 = *puVar8;
        ppEVar7 = std::
                  _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>
                  ::operator*(&local_30);
        puVar8 = Entry_field_element<unsigned_int>::get_element
                           (&(*ppEVar7)->super_Entry_field_element_option);
        if (uVar1 != *puVar8) break;
        std::
        _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>
        ::operator++(&it2);
        std::
        _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>
        ::operator++(&local_30);
      }
      c1_local._7_1_ = false;
    }
    else {
      c1_local._7_1_ = false;
    }
  }
  return c1_local._7_1_;
}

Assistant:

bool operator==(const Set_column& c1, const Set_column& c2) {
    if (&c1 == &c2) return true;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    if (c1.column_.size() != c2.column_.size()) return false;
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_row_index() != (*it2)->get_row_index()) return false;
      } else {
        if ((*it1)->get_row_index() != (*it2)->get_row_index() || (*it1)->get_element() != (*it2)->get_element())
          return false;
      }
      ++it1;
      ++it2;
    }
    return true;
  }